

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoHppGenerator.cpp
# Opt level: O1

iterator __thiscall
VideoHppGenerator::addImplicitlyRequiredTypes
          (VideoHppGenerator *this,iterator typeIt,ExtensionData *extensionData,iterator reqIt)

{
  _Base_ptr p_Var1;
  size_t __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  RequireData *pRVar3;
  _Base_ptr p_Var4;
  ExtensionData *pEVar5;
  bool bVar6;
  int iVar7;
  iterator iVar8;
  iterator typeIt_00;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  iterator iVar10;
  const_iterator __it;
  MemberData *member;
  _Base_ptr p_Var11;
  const_iterator __it_00;
  long lVar12;
  _Base_ptr local_50;
  _Base_ptr *local_48;
  ExtensionData *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  local_50 = typeIt._M_node;
  local_40 = extensionData;
  iVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VideoHppGenerator::StructureData>_>_>
          ::find(&(this->m_structs)._M_t,typeIt._M_node + 1);
  if ((_Rb_tree_header *)iVar8._M_node == &(this->m_structs)._M_t._M_impl.super__Rb_tree_header) {
    __assert_fail("structIt != m_structs.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VideoHppGenerator.cpp"
                  ,0x6a,
                  "std::vector<std::string>::iterator VideoHppGenerator::addImplicitlyRequiredTypes(std::map<std::string, TypeData>::iterator, ExtensionData &, std::vector<std::string>::iterator)"
                 );
  }
  p_Var11 = *(_Base_ptr *)(iVar8._M_node + 2);
  p_Var1 = iVar8._M_node[2]._M_parent;
  if (p_Var11 != p_Var1) {
    do {
      typeIt_00 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
                  ::find(&(this->m_types)._M_t,(key_type *)(p_Var11 + 1));
      if (((_Rb_tree_header *)typeIt_00._M_node !=
           &(this->m_types)._M_t._M_impl.super__Rb_tree_header) &&
         (typeIt_00._M_node[2]._M_color == 9)) {
        reqIt = addImplicitlyRequiredTypes(this,(iterator)typeIt_00._M_node,local_40,reqIt);
      }
      p_Var11 = p_Var11 + 6;
    } while (p_Var11 != p_Var1);
  }
  pEVar5 = local_40;
  p_Var4 = local_50;
  p_Var11 = local_50[3]._M_left;
  if (p_Var11 != (_Base_ptr)0x0) {
    lVar12 = *(long *)(local_50 + 3);
    __n = *(size_t *)(lVar12 + 0x28);
    if (((__n != (local_40->name)._M_string_length) ||
        ((__n != 0 &&
         (iVar7 = bcmp(*(void **)(lVar12 + 0x20),(local_40->name)._M_dataplus._M_p,__n), iVar7 != 0)
         ))) && ((__n != (pEVar5->depends)._M_string_length ||
                 ((__n != 0 &&
                  (iVar7 = bcmp(*(void **)(lVar12 + 0x20),(pEVar5->depends)._M_dataplus._M_p,__n),
                  iVar7 != 0)))))) {
      __assert_fail("typeIt->second.requiredBy.empty() || ( *typeIt->second.requiredBy.begin() == extensionData.name ) || ( *typeIt->second.requiredBy.begin() == extensionData.depends )"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VideoHppGenerator.cpp"
                    ,0x74,
                    "std::vector<std::string>::iterator VideoHppGenerator::addImplicitlyRequiredTypes(std::map<std::string, TypeData>::iterator, ExtensionData &, std::vector<std::string>::iterator)"
                   );
    }
    if (p_Var11 != (_Base_ptr)0x0) {
      return (iterator)reqIt._M_current;
    }
  }
  _Var9 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    ((pEVar5->requireData).types.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,reqIt._M_current,p_Var4 + 1);
  if (_Var9._M_current != reqIt._M_current) {
    return (iterator)reqIt._M_current;
  }
  pbVar2 = (pEVar5->requireData).types.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_48 = &local_50;
  lVar12 = (long)pbVar2 - (long)reqIt._M_current >> 7;
  __it._M_current = reqIt._M_current;
  if (0 < lVar12) {
    local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&((reqIt._M_current)->_M_dataplus)._M_p +
               ((long)pbVar2 - (long)reqIt._M_current & 0xffffffffffffff80U));
    lVar12 = lVar12 + 1;
    __it_00._M_current = reqIt._M_current;
    do {
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::$_0>
              ::operator()((_Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::__0>
                            *)&local_48,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )__it_00._M_current);
      _Var9._M_current = __it_00._M_current;
      if (bVar6) goto LAB_00109236;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::$_0>
              ::operator()((_Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::__0>
                            *)&local_48,__it_00._M_current + 1);
      _Var9._M_current = __it_00._M_current + 1;
      if (bVar6) goto LAB_00109236;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::$_0>
              ::operator()((_Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::__0>
                            *)&local_48,__it_00._M_current + 2);
      _Var9._M_current = __it_00._M_current + 2;
      if (bVar6) goto LAB_00109236;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::$_0>
              ::operator()((_Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::__0>
                            *)&local_48,__it_00._M_current + 3);
      _Var9._M_current = __it_00._M_current + 3;
      if (bVar6) goto LAB_00109236;
      __it_00._M_current = __it_00._M_current + 4;
      lVar12 = lVar12 + -1;
      __it._M_current = local_38;
    } while (1 < lVar12);
  }
  lVar12 = (long)pbVar2 - (long)__it._M_current >> 5;
  if (lVar12 != 1) {
    if (lVar12 != 2) {
      _Var9._M_current = pbVar2;
      if ((lVar12 != 3) ||
         (bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::$_0>
                  ::operator()((_Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::__0>
                                *)&local_48,
                               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                )__it._M_current), _Var9._M_current = __it._M_current, bVar6))
      goto LAB_00109236;
      __it._M_current = __it._M_current + 1;
    }
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::$_0>
            ::operator()((_Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::__0>
                          *)&local_48,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )__it._M_current);
    _Var9._M_current = __it._M_current;
    if (bVar6) goto LAB_00109236;
    __it._M_current = __it._M_current + 1;
  }
  bVar6 = __gnu_cxx::__ops::
          _Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::$_0>
          ::operator()((_Iter_pred<VideoHppGenerator::addImplicitlyRequiredTypes(std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,TypeData>>,VideoHppGenerator::ExtensionData&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>)::__0>
                        *)&local_48,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )__it._M_current);
  _Var9._M_current = __it._M_current;
  if (!bVar6) {
    _Var9._M_current = pbVar2;
  }
LAB_00109236:
  if (_Var9._M_current == pbVar2) {
    pRVar3 = &local_40->requireData;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&local_50[2]._M_parent,&local_40->name);
    iVar10 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::insert(&pRVar3->types,reqIt._M_current,(value_type *)(local_50 + 1));
    return (iterator)(iVar10._M_current + 1);
  }
  __assert_fail("std::none_of( reqIt, extensionData.requireData.types.end(), [&typeIt]( std::string const & type ) { return type == typeIt->first; } )"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VideoHppGenerator.cpp"
                ,0x77,
                "std::vector<std::string>::iterator VideoHppGenerator::addImplicitlyRequiredTypes(std::map<std::string, TypeData>::iterator, ExtensionData &, std::vector<std::string>::iterator)"
               );
}

Assistant:

std::vector<std::string>::iterator VideoHppGenerator::addImplicitlyRequiredTypes( std::map<std::string, TypeData>::iterator typeIt,
                                                                                  ExtensionData &                           extensionData,
                                                                                  std::vector<std::string>::iterator        reqIt )
{
  auto structIt = m_structs.find( typeIt->first );
  assert( structIt != m_structs.end() );
  for ( auto const & member : structIt->second.members )
  {
    auto memberTypeIt = m_types.find( member.type.type );
    if ( ( memberTypeIt != m_types.end() ) && ( memberTypeIt->second.category == TypeCategory::Struct ) )
    {
      reqIt = addImplicitlyRequiredTypes( memberTypeIt, extensionData, reqIt );
    }
  }
  assert( typeIt->second.requiredBy.empty() || ( *typeIt->second.requiredBy.begin() == extensionData.name ) ||
          ( *typeIt->second.requiredBy.begin() == extensionData.depends ) );
  if ( typeIt->second.requiredBy.empty() && ( std::find( extensionData.requireData.types.begin(), reqIt, typeIt->first ) == reqIt ) )
  {
    assert( std::none_of( reqIt, extensionData.requireData.types.end(), [&typeIt]( std::string const & type ) { return type == typeIt->first; } ) );
    typeIt->second.requiredBy.insert( extensionData.name );
    reqIt = std::next( extensionData.requireData.types.insert( reqIt, typeIt->first ) );
  }
  return reqIt;
}